

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createIntrinsic
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  int iVar1;
  PSNode *pPVar2;
  raw_ostream *prVar3;
  StringRef Str;
  StringRef Str_00;
  PSNode *local_40;
  initializer_list<dg::pta::PSNode_*> local_38;
  
  iVar1 = *(int *)(*(long *)(Inst + -0x20) + 0x24);
  if (iVar1 < 0xc4) {
    if (1 < iVar1 - 0xc1U) {
      if (iVar1 == 0xa4) {
        local_40 = createLifetimeEnd(this,Inst);
        goto LAB_00121b27;
      }
      if (iVar1 != 0xbf) goto LAB_00121b48;
    }
    pPVar2 = createMemTransfer(this,(IntrinsicInst *)Inst);
    PSNodesSeq::PSNodesSeq(__return_storage_ptr__,pPVar2);
  }
  else {
    if (iVar1 < 0x11a) {
      if (iVar1 == 0xc4) {
        createMemSet(__return_storage_ptr__,this,Inst);
        return __return_storage_ptr__;
      }
      if (iVar1 != 0x119) {
LAB_00121b48:
        prVar3 = (raw_ostream *)llvm::errs();
        prVar3 = llvm::operator<<(prVar3,(Value *)Inst);
        llvm::raw_ostream::operator<<(prVar3,"\n");
        prVar3 = (raw_ostream *)llvm::errs();
        llvm::raw_ostream::operator<<(prVar3,"Unhandled intrinsic ^^\n");
        abort();
      }
      local_40 = createInternalLoad(this,Inst);
    }
    else {
      if (iVar1 != 0x11a) {
        if (iVar1 == 0x134) {
          createVarArg(__return_storage_ptr__,this,(IntrinsicInst *)Inst);
          return __return_storage_ptr__;
        }
        goto LAB_00121b48;
      }
      prVar3 = (raw_ostream *)llvm::errs();
      Str.Length = 0x32;
      Str.Data = "WARNING: Saving stack may yield unsound results!: ";
      prVar3 = llvm::raw_ostream::operator<<(prVar3,Str);
      llvm::Value::print((raw_ostream *)Inst,SUB81(prVar3,0));
      Str_00.Length = 1;
      Str_00.Data = "\n";
      llvm::raw_ostream::operator<<(prVar3,Str_00);
      pPVar2 = PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
      local_40 = (PSNode *)0x0;
      if (pPVar2->type == ALLOC) {
        local_40 = pPVar2;
      }
    }
LAB_00121b27:
    local_38._M_array = &local_40;
    local_38._M_len = 1;
    PSNodesSeq::PSNodesSeq(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createIntrinsic(const llvm::Instruction *Inst) {
    using namespace llvm;

    const IntrinsicInst *I = cast<IntrinsicInst>(Inst);
    if (isa<MemTransferInst>(I)) {
        return createMemTransfer(I);
    }
    if (isa<MemSetInst>(I)) {
        return createMemSet(I);
    }

    switch (I->getIntrinsicID()) {
    case Intrinsic::vastart:
        return createVarArg(I);
    case Intrinsic::stacksave:
        errs() << "WARNING: Saving stack may yield unsound results!: " << *Inst
               << "\n";
        return {PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>())};
    case Intrinsic::stackrestore:
        return {createInternalLoad(Inst)};
    case Intrinsic::lifetime_end:
        return {createLifetimeEnd(Inst)};
    default:
        errs() << *Inst << "\n";
        errs() << "Unhandled intrinsic ^^\n";
        abort();
    }
}